

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockDXT.cpp
# Opt level: O0

void __thiscall nv::BlockATI1::decodeBlock(BlockATI1 *this,ColorBlock *block)

{
  uint8 uVar1;
  Color32 *pCVar2;
  Color32 *c;
  byte local_38 [4];
  uint i;
  uint8 index_array [16];
  uint8 local_20 [8];
  uint8 alpha_array [8];
  ColorBlock *block_local;
  BlockATI1 *this_local;
  
  alpha_array = (uint8  [8])block;
  AlphaBlockDXT5::evaluatePalette(&this->alpha,local_20);
  AlphaBlockDXT5::indices(&this->alpha,local_38);
  for (c._4_4_ = 0; c._4_4_ < 0x10; c._4_4_ = c._4_4_ + 1) {
    pCVar2 = ColorBlock::color((ColorBlock *)alpha_array,c._4_4_);
    uVar1 = local_20[local_38[c._4_4_]];
    (pCVar2->field_0).field_0.r = uVar1;
    (pCVar2->field_0).field_0.g = uVar1;
    (pCVar2->field_0).field_0.b = uVar1;
    (pCVar2->field_0).field_0.a = 0xff;
  }
  return;
}

Assistant:

void BlockATI1::decodeBlock(ColorBlock * block) const
{
	uint8 alpha_array[8];
	alpha.evaluatePalette(alpha_array);
	
	uint8 index_array[16];
	alpha.indices(index_array);
	
	for(uint i = 0; i < 16; i++) {
		Color32 & c = block->color(i);
		c.b = c.g = c.r = alpha_array[index_array[i]];
		c.a = 255;
	}
}